

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterGotoPage(Fts5Index *p,Fts5SegIter *pIter,int iLeafPgno)

{
  int iVar1;
  u8 *puVar2;
  byte bVar3;
  u16 uVar4;
  uint uVar5;
  int n;
  u8 *a;
  int iOff;
  int iLeafPgno_local;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  if (pIter->pSeg->pgnoLast < iLeafPgno) {
    p->rc = 0x10b;
  }
  else {
    fts5DataRelease(pIter->pNextLeaf);
    pIter->pNextLeaf = (Fts5Data *)0x0;
    pIter->iLeafPgno = iLeafPgno + -1;
    fts5SegIterNextPage(p,pIter);
    if (p->rc == 0) {
      puVar2 = pIter->pLeaf->p;
      iVar1 = pIter->pLeaf->szLeaf;
      uVar4 = fts5GetU16(pIter->pLeaf->p);
      uVar5 = (uint)uVar4;
      if ((uVar5 < 4) || (iVar1 <= (int)uVar5)) {
        p->rc = 0x10b;
      }
      else {
        bVar3 = sqlite3Fts5GetVarint(puVar2 + (int)uVar5,(u64 *)&pIter->iRowid);
        pIter->iLeafOffset = bVar3 + uVar5;
        fts5SegIterLoadNPos(p,pIter);
      }
    }
  }
  return;
}

Assistant:

static void fts5SegIterGotoPage(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int iLeafPgno
){
  assert( iLeafPgno>pIter->iLeafPgno );

  if( iLeafPgno>pIter->pSeg->pgnoLast ){
    p->rc = FTS5_CORRUPT;
  }else{
    fts5DataRelease(pIter->pNextLeaf);
    pIter->pNextLeaf = 0;
    pIter->iLeafPgno = iLeafPgno-1;
    fts5SegIterNextPage(p, pIter);
    assert( p->rc!=SQLITE_OK || pIter->iLeafPgno==iLeafPgno );

    if( p->rc==SQLITE_OK ){
      int iOff;
      u8 *a = pIter->pLeaf->p;
      int n = pIter->pLeaf->szLeaf;

      iOff = fts5LeafFirstRowidOff(pIter->pLeaf);
      if( iOff<4 || iOff>=n ){
        p->rc = FTS5_CORRUPT;
      }else{
        iOff += fts5GetVarint(&a[iOff], (u64*)&pIter->iRowid);
        pIter->iLeafOffset = iOff;
        fts5SegIterLoadNPos(p, pIter);
      }
    }
  }
}